

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O1

IterateResult __thiscall
gl4cts::UncommittedRegionsAccessTestCase::iterate(UncommittedRegionsAccessTestCase *this)

{
  ostringstream *this_00;
  bool bVar1;
  Functions *gl;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  char *description;
  uint *puVar6;
  qpTestResult testResult;
  TestContext *this_01;
  uint level;
  GLuint texture;
  uint *local_200;
  GLuint local_1f4;
  uint *local_1f0;
  Functions *local_1e8;
  string *local_1e0;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  ostream *local_1b8;
  undefined1 local_1b0 [16];
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_SparseTexture2CommitmentTestCase).
                      super_SparseTextureCommitmentTestCase.super_TestCase.m_context)->m_contextInfo
                     ,"GL_ARB_sparse_texture2");
  if (bVar2) {
    iVar3 = (*((this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
               super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])();
    local_1e8 = (Functions *)CONCAT44(extraout_var,iVar3);
    local_200 = (uint *)(this->super_SparseTexture2CommitmentTestCase).
                        super_SparseTextureCommitmentTestCase.mSupportedTargets.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
    if (local_200 !=
        (uint *)(this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase
                .mSupportedTargets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
      local_1e0 = (string *)
                  &(this->super_SparseTexture2CommitmentTestCase).
                   super_SparseTextureCommitmentTestCase.field_0x90;
      local_1b8 = (ostream *)
                  &(this->super_SparseTexture2CommitmentTestCase).
                   super_SparseTextureCommitmentTestCase.field_0x88;
      bVar2 = true;
      do {
        puVar6 = (uint *)(this->super_SparseTexture2CommitmentTestCase).
                         super_SparseTextureCommitmentTestCase.mSupportedInternalFormats.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
        iVar3 = 5;
        if (puVar6 != (uint *)(this->super_SparseTexture2CommitmentTestCase).
                              super_SparseTextureCommitmentTestCase.mSupportedInternalFormats.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish) {
          do {
            iVar4 = (*(this->super_SparseTexture2CommitmentTestCase).
                      super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase.
                      super_TestNode._vptr_TestNode[6])(this,(ulong)*local_200,(ulong)*puVar6);
            iVar3 = 7;
            if ((char)iVar4 != '\0') {
              local_1b0._0_8_ = local_1a0;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,0x1b32ab9);
              std::__cxx11::stringbuf::str(local_1e0);
              local_1f0 = puVar6;
              if ((TestLog *)local_1b0._0_8_ != local_1a0) {
                operator_delete((void *)local_1b0._0_8_,
                                (ulong)((long)&(local_1a0[0].m_log)->flags + 1));
              }
              poVar5 = local_1b8;
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_1b8,"Testing uncommitted regions access for target: ",0x2f);
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,*local_200);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,", format: ",10);
              puVar6 = local_1f0;
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,*local_1f0);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5," - ",3);
              (*(this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase
                .super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[8])
                        (this,local_1e8,(ulong)*local_200,(ulong)*puVar6,&local_1f4,3);
              if (0 < (this->super_SparseTexture2CommitmentTestCase).
                      super_SparseTextureCommitmentTestCase.mState.levels) {
                iVar3 = 1;
                do {
                  gl = local_1e8;
                  puVar6 = local_1f0;
                  level = iVar3 - 1;
                  iVar4 = (*(this->super_SparseTexture2CommitmentTestCase).
                            super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase.
                            super_TestNode._vptr_TestNode[0xc])
                                    (this,local_1e8,(ulong)*local_200,(ulong)*local_1f0,&local_1f4);
                  if ((char)iVar4 != '\0') {
                    (*(this->super_SparseTexture2CommitmentTestCase).
                      super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase.
                      super_TestNode._vptr_TestNode[10])
                              (this,gl,(ulong)*local_200,(ulong)*puVar6,&local_1f4,(ulong)level);
                    if (((bVar2 == false) ||
                        (bVar2 = UncommittedReads(this,gl,*local_200,*puVar6,&local_1f4,level),
                        !bVar2)) ||
                       (bVar2 = UncommittedAtomicOperations
                                          (this,gl,*local_200,*puVar6,&local_1f4,level), !bVar2)) {
                      bVar2 = false;
                    }
                    else {
                      bVar2 = UncommittedDepthStencil(this,gl,*local_200,*puVar6,&local_1f4,level);
                    }
                  }
                } while ((bVar2 != false) &&
                        (bVar1 = iVar3 < (this->super_SparseTexture2CommitmentTestCase).
                                         super_SparseTextureCommitmentTestCase.mState.levels,
                        iVar3 = iVar3 + 1, bVar1));
              }
              gl4cts::Texture::Delete(local_1e8,&local_1f4);
              iVar3 = 0;
              puVar6 = local_1f0;
              if (bVar2 == false) {
                local_1b0._0_8_ =
                     ((this->super_SparseTexture2CommitmentTestCase).
                      super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx)->m_log;
                this_00 = (ostringstream *)(local_1b0 + 8);
                std::__cxx11::ostringstream::ostringstream(this_00);
                std::__cxx11::stringbuf::str();
                puVar6 = local_1f0;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)this_00,(char *)local_1d8,local_1d0);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Fail",4);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                if (local_1d8 != local_1c8) {
                  operator_delete(local_1d8,local_1c8[0] + 1);
                }
                std::__cxx11::ostringstream::~ostringstream(this_00);
                std::ios_base::~ios_base(local_138);
                iVar3 = 1;
                tcu::TestContext::setTestResult
                          ((this->super_SparseTexture2CommitmentTestCase).
                           super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase.
                           super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Fail");
              }
            }
            if ((iVar3 != 7) && (iVar3 != 0)) goto LAB_00a68bea;
            puVar6 = puVar6 + 1;
          } while (puVar6 != (uint *)(this->super_SparseTexture2CommitmentTestCase).
                                     super_SparseTextureCommitmentTestCase.mSupportedInternalFormats
                                     .super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish);
          iVar3 = 5;
        }
LAB_00a68bea:
        if ((iVar3 != 5) && (iVar3 != 0)) {
          return STOP;
        }
        local_200 = local_200 + 1;
      } while (local_200 !=
               (uint *)(this->super_SparseTexture2CommitmentTestCase).
                       super_SparseTextureCommitmentTestCase.mSupportedTargets.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_finish);
    }
    this_01 = (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
              super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    this_01 = (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
              super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_01,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult UncommittedRegionsAccessTestCase::iterate()
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_texture2"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");
		return STOP;
	}

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool result = true;

	GLuint texture;

	for (std::vector<glw::GLint>::const_iterator iter = mSupportedTargets.begin(); iter != mSupportedTargets.end();
		 ++iter)
	{
		const GLint& target = *iter;

		for (std::vector<glw::GLint>::const_iterator formIter = mSupportedInternalFormats.begin();
			 formIter != mSupportedInternalFormats.end(); ++formIter)
		{
			const GLint& format = *formIter;

			if (!caseAllowed(target, format))
				continue;

			mLog.str("");
			mLog << "Testing uncommitted regions access for target: " << target << ", format: " << format << " - ";

			sparseAllocateTexture(gl, target, format, texture, 3);
			for (int l = 0; l < mState.levels; ++l)
			{
				if (commitTexturePage(gl, target, format, texture, l))
				{
					writeDataToTexture(gl, target, format, texture, l);
					result = result && UncommittedReads(gl, target, format, texture, l);
					result = result && UncommittedAtomicOperations(gl, target, format, texture, l);
					result = result && UncommittedDepthStencil(gl, target, format, texture, l);
				}

				if (!result)
					break;
			}

			Texture::Delete(gl, texture);

			if (!result)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << mLog.str() << "Fail" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
				return STOP;
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}